

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O1

void __thiscall AVavoomLightColor::BeginPlay(AVavoomLightColor *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ADynamicLight *pAVar5;
  
  iVar1 = (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[0];
  iVar2 = (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[1];
  iVar3 = (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[2];
  iVar4 = (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[3];
  (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[0] = 0;
  (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[1] = 0;
  pAVar5 = &(this->super_AVavoomLight).super_ADynamicLight;
  (pAVar5->super_AActor).args[2] = 0;
  (pAVar5->super_AActor).args[3] = 0;
  (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[4] = 0;
  (this->super_AVavoomLight).super_ADynamicLight.m_Radius[0] = iVar1 << 2;
  (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[0] = iVar2 >> 1;
  (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[1] = iVar3 >> 1;
  (this->super_AVavoomLight).super_ADynamicLight.super_AActor.args[2] = iVar4 >> 1;
  AVavoomLight::BeginPlay(&this->super_AVavoomLight);
  return;
}

Assistant:

void AVavoomLightColor::BeginPlay ()
{
	int l_args[5];
	memcpy(l_args, args, sizeof(l_args));
	memset(args, 0, sizeof(args));
	m_Radius[0] = l_args[0] * 4;
	args[LIGHT_RED] = l_args[1] >> 1;
	args[LIGHT_GREEN] = l_args[2] >> 1;
	args[LIGHT_BLUE] = l_args[3] >> 1;

	Super::BeginPlay();
}